

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O3

bool __thiscall
USBSignalFilter::GetPacket(USBSignalFilter *this,USBPacket *pckt,USBSignalState *sgnl)

{
  pointer *ppuVar1;
  pointer puVar2;
  pointer puVar3;
  iterator iVar4;
  iterator __position;
  pointer puVar5;
  USBPacket *pUVar6;
  byte bVar7;
  uint uVar8;
  U64 UVar9;
  USB_PID UVar10;
  ulong uVar11;
  long lVar12;
  Channel *pCVar13;
  bool bVar14;
  uint uVar15;
  char *pcVar16;
  char *pcVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined4 uVar22;
  undefined4 uVar23;
  U8 bits2add [7];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bits;
  U8 val;
  undefined4 uStack_a0;
  undefined3 uStack_9c;
  char *local_98;
  char *pcStack_90;
  undefined8 local_88;
  vector<unsigned_long_long,std::allocator<unsigned_long_long>> *local_80;
  USBPacket *local_78;
  USBSignalState local_70;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_50;
  double local_48;
  undefined8 uStack_40;
  
  puVar2 = (pckt->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pckt->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (pckt->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar3 = (pckt->mBitBeginSamples).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pckt->mBitBeginSamples).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (pckt->mBitBeginSamples).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  pckt->mPID = PID_Unknown;
  pckt->mCRC = 0;
  pckt->mSampleBegin = 0;
  pckt->mSampleEnd = 0;
  uStack_9c = 0x10101;
  uStack_a0 = 0x1010100;
  if (this->mExpectLowSpeed == false) {
    dVar19 = *(double *)(&DAT_00155190 + (ulong)(this->mSpeed == FULL_SPEED) * 8);
  }
  else {
    dVar19 = sgnl->mDur;
    if ((((dVar19 <= 24.999999999999996) || (625.0 <= dVar19)) || (S_J < sgnl->mState)) ||
       ((int)(dVar19 / 83.33333333333333 + 0.5) != 1)) {
      this->mSpeed = LOW_SPEED;
      dVar19 = 666.6666666666666;
    }
    else {
      this->mSpeed = FULL_SPEED;
      this->mExpectLowSpeed = false;
      dVar19 = 83.33333333333333;
    }
  }
  local_50 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&pckt->mData;
  local_80 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
             &pckt->mBitBeginSamples;
  uVar8 = Analyzer::GetSampleRate();
  dVar19 = dVar19 / (1000000000.0 / (double)uVar8);
  local_98 = (char *)0x0;
  pcStack_90 = (char *)0x0;
  local_88 = 0;
  pckt->mSampleBegin = sgnl->mSampleBegin;
  bVar14 = false;
  bVar18 = false;
  local_78 = pckt;
  do {
    pUVar6 = local_78;
    dVar20 = sgnl->mDur;
    if (this->mSpeed == LOW_SPEED) {
      if (dVar20 <= 466.66666666666663) break;
      uVar22 = 0xaaaaaaaa;
      uVar23 = 0x40b302aa;
    }
    else {
      if (dVar20 <= 24.999999999999996) break;
      uVar22 = 0;
      uVar23 = 0x40838800;
    }
    if (((double)CONCAT44(uVar23,uVar22) < dVar20 || (double)CONCAT44(uVar23,uVar22) == dVar20) ||
       (S_J < sgnl->mState || bVar14)) break;
    uVar8 = (uint)(dVar20 / *(double *)(&DAT_00155190 + (ulong)(this->mSpeed == FULL_SPEED) * 8) +
                  0.5);
    if (0 < (int)uVar8) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,pcStack_90,
                 (long)&uStack_a0 + (ulong)bVar18,(long)&uStack_a0 + (ulong)uVar8);
      uVar15 = 0;
      do {
        UVar9 = sgnl->mSampleBegin;
        local_48 = (double)(int)uVar15;
        uStack_40 = 0;
        if ((bool)(uVar15 != 0 | ~bVar18 & 1U)) {
          dVar20 = dVar19 * local_48 + 0.5;
          uVar11 = (ulong)dVar20;
          local_70.mSampleBegin =
               UVar9 + ((long)(dVar20 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11);
          iVar4._M_current =
               (local_78->mBitBeginSamples).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (local_78->mBitBeginSamples).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
            _M_realloc_insert<unsigned_long_long>
                      ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_80,
                       iVar4,&local_70.mSampleBegin);
          }
          else {
            *iVar4._M_current = local_70.mSampleBegin;
            (local_78->mBitBeginSamples).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          UVar9 = sgnl->mSampleBegin;
        }
        dVar20 = (local_48 + 0.5) * dVar19 + 0.5;
        lVar12 = (long)dVar20;
        pCVar13 = (Channel *)0xa;
        if (uVar15 == 0) {
          pCVar13 = (Channel *)(ulong)((uint)(byte)~bVar18 * 4 + 7);
        }
        AnalyzerResults::AddMarker
                  ((ulonglong)this->mResults,
                   ((uint)(long)(dVar20 - 9.223372036854776e+18) & (uint)(lVar12 >> 0x3f) |
                   (uint)lVar12) + (int)UVar9,pCVar13);
        uVar15 = uVar15 + 1;
      } while (uVar8 != uVar15);
    }
    if (((this->mSpeed == FULL_SPEED) && ((long)pcStack_90 - (long)local_98 == 0x10)) &&
       ((pcStack_90 == local_98 ||
        (auVar21[0] = -(*local_98 == '\0'), auVar21[1] = -(local_98[1] == '\0'),
        auVar21[2] = -(local_98[2] == '\0'), auVar21[3] = -(local_98[3] == '\0'),
        auVar21[4] = -(local_98[4] == '\0'), auVar21[5] = -(local_98[5] == '\0'),
        auVar21[6] = -(local_98[6] == '\0'), auVar21[7] = -(local_98[7] == '\x01'),
        auVar21[8] = -(local_98[8] == '\0'), auVar21[9] = -(local_98[9] == '\0'),
        auVar21[10] = -(local_98[10] == '\x01'), auVar21[0xb] = -(local_98[0xb] == '\x01'),
        auVar21[0xc] = -(local_98[0xc] == '\x01'), auVar21[0xd] = -(local_98[0xd] == '\x01'),
        auVar21[0xe] = -(local_98[0xe] == '\0'), auVar21[0xf] = -(local_98[0xf] == '\0'),
        (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf
                ) == 0xffff)))) {
      this->mSpeed = LOW_SPEED;
      this->mExpectLowSpeed = true;
      bVar14 = true;
    }
    else {
      bVar14 = false;
    }
    GetState(&local_70,this);
    bVar18 = uVar8 == 7;
    sgnl->mState = local_70.mState;
    *(undefined4 *)&sgnl->field_0x14 = local_70._20_4_;
    sgnl->mDur = local_70.mDur;
    sgnl->mSampleBegin = local_70.mSampleBegin;
    sgnl->mSampleEnd = local_70.mSampleEnd;
  } while( true );
  local_78->mSampleEnd = sgnl->mSampleEnd;
  iVar4._M_current =
       (local_78->mBitBeginSamples).
       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (local_78->mBitBeginSamples).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
    _M_realloc_insert<unsigned_long_long_const&>(local_80,iVar4,&sgnl->mSampleBegin);
  }
  else {
    *iVar4._M_current = sgnl->mSampleBegin;
    (local_78->mBitBeginSamples).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  if (((local_98 == pcStack_90) || (((int)pcStack_90 - (int)local_98 & 7U) != 0)) ||
     (puVar3 = (pUVar6->mBitBeginSamples).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_start,
     (*(int *)&(pUVar6->mBitBeginSamples).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish - (int)puVar3 & 0x38U) != 8)) {
    bVar18 = false;
    goto LAB_00138f93;
  }
  pUVar6->mSampleBegin = *puVar3;
  pUVar6->mSampleEnd = (long)(dVar19 + 0.5) + sgnl->mSampleEnd;
  local_70.mSampleBegin = local_70.mSampleBegin & 0xffffffffffffff00;
  pcVar17 = local_98;
  pcVar16 = local_98;
  do {
    pcVar16 = pcVar16 + 1;
    bVar7 = (byte)local_70.mSampleBegin >> 1;
    if (*pcVar17 != '\0') {
      bVar7 = bVar7 | 0x80;
    }
    local_70.mSampleBegin = CONCAT71(local_70.mSampleBegin._1_7_,bVar7);
    if (((int)pcVar16 - (int)local_98 & 7U) == 0) {
      __position._M_current =
           (pUVar6->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pUVar6->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>(local_50,__position,(uchar *)&local_70);
      }
      else {
        *__position._M_current = bVar7;
        ppuVar1 = &(pUVar6->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
    }
    pcVar17 = pcVar17 + 1;
  } while (pcVar17 != pcStack_90);
  puVar2 = (pUVar6->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar5 = (pUVar6->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  uVar11 = (long)puVar5 - (long)puVar2;
  if (uVar11 < 2) {
    UVar10 = pUVar6->mPID;
LAB_00138fb6:
    bVar14 = false;
  }
  else {
    bVar7 = puVar2[1];
    UVar10 = (USB_PID)bVar7;
    pUVar6->mPID = (uint)bVar7;
    if (uVar11 < 4) goto LAB_00138fb6;
    if (uVar11 == 4) {
      pUVar6->mCRC = (ushort)(puVar5[-1] >> 3);
    }
    else {
      pUVar6->mCRC = CONCAT11(puVar5[-1],puVar5[-2]);
    }
    bVar14 = true;
  }
  bVar18 = false;
  if ((int)UVar10 < 0x69) {
    if ((int)UVar10 < 0x3c) {
      if (UVar10 != PID_STALL) {
        if (UVar10 != PID_SETUP) goto LAB_00138f93;
        goto LAB_0013902f;
      }
LAB_0013906c:
      bVar18 = true;
      if (uVar11 == 2) goto LAB_00138f93;
      if (UVar10 == PID_SOF) goto LAB_00139087;
      if (UVar10 != PID_PRE) goto LAB_00139090;
    }
    else {
LAB_00138fda:
      bVar18 = false;
      if (UVar10 != PID_PRE) {
        if (UVar10 == PID_DATA1) goto LAB_00139059;
        if (UVar10 != PID_NAK) goto LAB_00138f93;
        goto LAB_0013906c;
      }
    }
    bVar18 = uVar11 == 2;
  }
  else {
    if (0xc2 < (int)UVar10) {
      if (UVar10 != PID_DATA0) {
        if (UVar10 == PID_ACK) goto LAB_0013906c;
        if (UVar10 != PID_OUT) goto LAB_00138f93;
LAB_0013902f:
        bVar18 = true;
        if (uVar11 == 4) goto LAB_00138f93;
        bVar18 = false;
        if ((int)UVar10 < 0xa5) goto LAB_00138fda;
        if (UVar10 == PID_SOF) goto LAB_00139087;
        if (UVar10 == PID_ACK) goto LAB_0013906c;
        if (UVar10 != PID_DATA0) goto LAB_00138f93;
      }
LAB_00139059:
      bVar18 = true;
      if (bVar14) goto LAB_00138f93;
      if (UVar10 == PID_SOF) goto LAB_00139087;
      if (UVar10 == PID_NAK) goto LAB_0013906c;
LAB_00139090:
      bVar18 = false;
      goto LAB_00138f93;
    }
    if (UVar10 == PID_IN) goto LAB_0013902f;
    if (UVar10 != PID_SOF) goto LAB_00138f93;
LAB_00139087:
    bVar18 = uVar11 == 4;
  }
LAB_00138f93:
  if (local_98 != (char *)0x0) {
    operator_delete(local_98);
  }
  return bVar18;
}

Assistant:

bool USBSignalFilter::GetPacket( USBPacket& pckt, USBSignalState& sgnl )
{
    pckt.Clear();

    const U8 bits2add[] = { 0, 1, 1, 1, 1, 1, 1 };

    // a PRE packet switched us into low speed mode, so now we need to check
    // if this packet is low or full speed
    if( mExpectLowSpeed )
    {
        if( sgnl.IsData( FULL_SPEED ) && sgnl.GetNumBits( FULL_SPEED ) == 1 )
        {
            mSpeed = FULL_SPEED;
            mExpectLowSpeed = false; // switch back to full speed
        }
        else
        {
            mSpeed = LOW_SPEED;
        }
    }

    const double BIT_DUR = ( mSpeed == FULL_SPEED ? FS_BIT_DUR : LS_BIT_DUR );
    const double SAMPLE_DUR = 1e9 / mAnalyzer->GetSampleRate(); // 1 sample duration in ns
    const double BIT_SAMPLES = BIT_DUR / SAMPLE_DUR;

    std::vector<U8> bits;

    pckt.mSampleBegin = sgnl.mSampleBegin; // default for bad packets

    bool is_stuff_bit = false;
    bool is_pre_packet = false;
    while( sgnl.IsData( mSpeed ) && !is_pre_packet )
    {
        // get the number of bits in this signal
        int num_bits = sgnl.GetNumBits( mSpeed );

        const U8* add_begin = bits2add;
        const U8* add_end = bits2add + num_bits;

        // mind the stuffing bit
        if( is_stuff_bit )
            ++add_begin;

        // now add the data bits
        if( ( is_stuff_bit && num_bits > 1 ) || ( num_bits > 0 ) )
            bits.insert( bits.end(), add_begin, add_end );

        // do the bit markers and remember the samples at which a bit begins
        int bc;
        for( bc = 0; bc < num_bits; ++bc )
        {
            if( !is_stuff_bit || bc > 0 )
                pckt.mBitBeginSamples.push_back( sgnl.mSampleBegin + U64( BIT_SAMPLES * bc + .5 ) );

            mResults->AddMarker( sgnl.mSampleBegin + U64( BIT_SAMPLES * ( bc + .5 ) + .5 ),
                                 bc == 0 ? ( is_stuff_bit ? AnalyzerResults::ErrorX : AnalyzerResults::Zero ) : AnalyzerResults::One,
                                 mSettings->mDPChannel );
        }

        // check if this is a PRE token, in which case we switch to low-speed,
        // return and wait for the next packet
        if( mSpeed == FULL_SPEED && bits.size() == 16 ) // 8 bits for SYNC and 8 bits for PRE PID
        {
            const U8 preArr[ 16 ] = { 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 1, 1, 1, 1, 0, 0 }; // SYNC and PRE as they appear on the bus
            if( std::equal( bits.begin(), bits.end(), preArr ) )
            {
                mSpeed = LOW_SPEED;
                mExpectLowSpeed = true;
                is_pre_packet = true;
            }
        }

        // set the stuff bit flag for the next state
        is_stuff_bit = ( num_bits == 7 );

        // get the next signal state
        sgnl = GetState();
    }

    pckt.mSampleEnd = sgnl.mSampleEnd; // default for bad packets

    // add another element to mBitBeginSamples to mark the end of the last bit
    pckt.mBitBeginSamples.push_back( sgnl.mSampleBegin );

    // check the number of bits
    if( bits.empty() || ( bits.size() % 8 ) != 0 || ( pckt.mBitBeginSamples.size() % 8 ) != 1 )
    {
        return false;
    }

    // remember the begin & end samples for the entire packet
    pckt.mSampleBegin = pckt.mBitBeginSamples.front();
    pckt.mSampleEnd = sgnl.mSampleEnd + S64( BIT_DUR / SAMPLE_DUR + 0.5 );

    // make bytes out of these bits
    U8 val = 0;
    std::vector<U8>::iterator i( bits.begin() );
    while( i != bits.end() )
    {
        // least significant bit first
        val >>= 1;
        if( *i )
            val |= 0x80;

        ++i;

        // do we have a full byte?
        if( ( ( i - bits.begin() ) % 8 ) == 0 )
            pckt.mData.push_back( val );
    }

    // extract the PID
    if( pckt.mData.size() > 1 )
        pckt.mPID = USB_PID( pckt.mData[ 1 ] );

    // extract the CRC fields
    if( pckt.mData.size() >= 4 )
    {
        U16 last_word = ( pckt.mData.back() << 8 ) | *( pckt.mData.end() - 2 );

        if( pckt.mData.size() == 4 )
            pckt.mCRC = last_word >> 11;
        else
            pckt.mCRC = last_word;
    }

    return ( pckt.IsTokenPacket() && pckt.mData.size() == 4 ) || ( pckt.IsDataPacket() && pckt.mData.size() >= 4 ) ||
           ( pckt.IsHandshakePacket() && pckt.mData.size() == 2 ) || ( pckt.mPID == PID_PRE && pckt.mData.size() == 2 ) ||
           ( pckt.IsSOFPacket() && pckt.mData.size() == 4 );
}